

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

void * __thiscall QGuiApplication::resolveInterface(QGuiApplication *this,char *name,int revision)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  QDebug *pQVar6;
  QPlatformNativeInterface *pQVar7;
  uint in_EDX;
  char *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QPlatformIntegration *platformIntegration;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_9;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_7;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_6;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_5;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffd28;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  uint in_stack_fffffffffffffd3c;
  QMessageLogger *in_stack_fffffffffffffd40;
  QDebug *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  void *local_280;
  void *local_220;
  char local_218 [32];
  char local_1f8 [64];
  QDebug local_1b8;
  QDebug local_1b0;
  QDebug local_1a8;
  char local_1a0 [32];
  char local_180 [32];
  char local_160 [32];
  char local_140 [64];
  QDebug local_100;
  QDebug local_f8;
  QDebug local_f0;
  char local_e8 [32];
  char local_c8 [32];
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplicationPrivate::platformIntegration();
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcNativeInterface();
  anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x36ea53);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffd40,
               (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
               (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(char *)in_stack_fffffffffffffd28,
               (char *)0x36ea6c);
    pcVar5 = QNativeInterface::Private::TypeInfo<QNativeInterface::QX11Application>::name();
    QMessageLogger::debug
              (local_c8,"Comparing requested interface name %s with available %s",in_RSI,pcVar5);
    local_10 = 0;
  }
  pcVar5 = QNativeInterface::Private::TypeInfo<QNativeInterface::QX11Application>::name();
  iVar2 = qstrcmp(in_RSI,pcVar5);
  if (iVar2 == 0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcNativeInterface();
    anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
      anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x36eb2d);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffd40,
                 (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(char *)in_stack_fffffffffffffd28,
                 (char *)0x36eb46);
      uVar3 = QNativeInterface::Private::TypeInfo<QNativeInterface::QX11Application>::revision();
      QMessageLogger::debug
                (local_e8,
                 "Match for interface %s. Comparing revisions (requested %d / available %d)",in_RSI,
                 (ulong)in_EDX,(ulong)uVar3);
      local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
    }
    uVar3 = QNativeInterface::Private::TypeInfo<QNativeInterface::QX11Application>::revision();
    if (in_EDX == uVar3) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcNativeInterface();
      anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
        anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x36ec06);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffd40,
                   (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                   (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(char *)in_stack_fffffffffffffd28
                   ,(char *)0x36ec1f);
        QMessageLogger::debug();
        pQVar6 = QDebug::operator<<(in_stack_fffffffffffffd48,
                                    (char *)CONCAT44(in_stack_fffffffffffffd7c,
                                                     in_stack_fffffffffffffd78));
        QDebug::QDebug(&local_f8,pQVar6);
        platformNativeInterface();
        ::operator<<((Stream *)&local_f0,(QObject *)&local_f8);
        QDebug::~QDebug(&local_f0);
        QDebug::~QDebug(&local_f8);
        QDebug::~QDebug(&local_100);
        local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
      }
      pQVar7 = platformNativeInterface();
      if (pQVar7 == (QPlatformNativeInterface *)0x0) {
        local_280 = (void *)0x0;
      }
      else {
        local_280 = (void *)__dynamic_cast(pQVar7,&QPlatformNativeInterface::typeinfo,
                                           &QNativeInterface::QX11Application::typeinfo,
                                           0xfffffffffffffffe);
      }
      local_220 = local_280;
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcNativeInterface();
      anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffffd30,
                 in_stack_fffffffffffffd28);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_48), bVar1) {
        anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x36ed4d);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffd40,
                   (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                   (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(char *)in_stack_fffffffffffffd28
                   ,(char *)0x36ed66);
        uVar3 = in_EDX;
        uVar4 = QNativeInterface::Private::TypeInfo<QNativeInterface::QX11Application>::revision();
        QMessageLogger::warning
                  (local_140,
                   "Native interface revision mismatch (requested %d / available %d) for interface %s"
                   ,(ulong)uVar3,(ulong)uVar4,in_RSI);
        local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
      }
      local_220 = (void *)0x0;
    }
  }
  else {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcNativeInterface();
    anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_58), bVar1) {
      anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x36ee08);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffd40,
                 (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(char *)in_stack_fffffffffffffd28,
                 (char *)0x36ee21);
      QMessageLogger::debug(local_160,"No match for requested interface name %s",in_RSI);
      local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
    }
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcNativeInterface();
    anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_68), bVar1) {
      anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x36ee9e);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffd40,
                 (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(char *)in_stack_fffffffffffffd28,
                 (char *)0x36eeb7);
      pcVar5 = QNativeInterface::Private::TypeInfo<QNativeInterface::QWaylandApplication>::name();
      QMessageLogger::debug
                (local_180,"Comparing requested interface name %s with available %s",in_RSI,pcVar5);
      local_60 = (undefined1 *)((ulong)local_60 & 0xffffffffffffff00);
    }
    pcVar5 = QNativeInterface::Private::TypeInfo<QNativeInterface::QWaylandApplication>::name();
    iVar2 = qstrcmp(in_RSI,pcVar5);
    if (iVar2 == 0) {
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcNativeInterface();
      anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_78), bVar1) {
        anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x36ef6c);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffd40,
                   (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                   (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(char *)in_stack_fffffffffffffd28
                   ,(char *)0x36ef85);
        uVar3 = QNativeInterface::Private::TypeInfo<QNativeInterface::QWaylandApplication>::revision
                          ();
        QMessageLogger::debug
                  (local_1a0,
                   "Match for interface %s. Comparing revisions (requested %d / available %d)",
                   in_RSI,(ulong)in_EDX,(ulong)uVar3);
        local_70 = (undefined1 *)((ulong)local_70 & 0xffffffffffffff00);
      }
      uVar3 = QNativeInterface::Private::TypeInfo<QNativeInterface::QWaylandApplication>::revision()
      ;
      if (in_EDX == uVar3) {
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcNativeInterface();
        anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_88), bVar1) {
          anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x36f045);
          QMessageLogger::QMessageLogger
                    (in_stack_fffffffffffffd40,
                     (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                     (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                     (char *)in_stack_fffffffffffffd28,(char *)0x36f05e);
          QMessageLogger::debug();
          pQVar6 = QDebug::operator<<(in_stack_fffffffffffffd48,
                                      (char *)CONCAT44(in_stack_fffffffffffffd7c,
                                                       in_stack_fffffffffffffd78));
          QDebug::QDebug(&local_1b0,pQVar6);
          platformNativeInterface();
          ::operator<<((Stream *)&local_1a8,(QObject *)&local_1b0);
          QDebug::~QDebug(&local_1a8);
          QDebug::~QDebug(&local_1b0);
          QDebug::~QDebug(&local_1b8);
          local_80 = (undefined1 *)((ulong)local_80 & 0xffffffffffffff00);
        }
        pQVar7 = platformNativeInterface();
        if (pQVar7 == (QPlatformNativeInterface *)0x0) {
          local_220 = (void *)0x0;
        }
        else {
          local_220 = (void *)__dynamic_cast(pQVar7,&QPlatformNativeInterface::typeinfo,
                                             &QNativeInterface::QWaylandApplication::typeinfo,
                                             0xfffffffffffffffe);
        }
      }
      else {
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcNativeInterface();
        anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffffd30,
                   in_stack_fffffffffffffd28);
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_98), bVar1) {
          anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x36f18c);
          QMessageLogger::QMessageLogger
                    (in_stack_fffffffffffffd40,
                     (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                     (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                     (char *)in_stack_fffffffffffffd28,(char *)0x36f1a5);
          in_stack_fffffffffffffd3c = in_EDX;
          uVar3 = QNativeInterface::Private::TypeInfo<QNativeInterface::QWaylandApplication>::
                  revision();
          QMessageLogger::warning
                    (local_1f8,
                     "Native interface revision mismatch (requested %d / available %d) for interface %s"
                     ,(ulong)in_stack_fffffffffffffd3c,(ulong)uVar3,in_RSI);
          local_90 = (undefined1 *)((ulong)local_90 & 0xffffffffffffff00);
        }
        local_220 = (void *)0x0;
      }
    }
    else {
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_a0 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcNativeInterface();
      anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_a8), bVar1) {
        anon_unknown.dwarf_45d841::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x36f247);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffd40,
                   (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                   (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(char *)in_stack_fffffffffffffd28
                   ,(char *)0x36f260);
        QMessageLogger::debug(local_218,"No match for requested interface name %s",in_RSI);
        local_a0 = (undefined1 *)((ulong)local_a0 & 0xffffffffffffff00);
      }
      local_220 = (void *)QCoreApplication::resolveInterface(in_RDI,(int)in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_220;
}

Assistant:

void *QGuiApplication::resolveInterface(const char *name, int revision) const
{
    using namespace QNativeInterface;
    using namespace QNativeInterface::Private;

    auto *platformIntegration = QGuiApplicationPrivate::platformIntegration();
    Q_UNUSED(platformIntegration);

#if defined(Q_OS_WIN)
    QT_NATIVE_INTERFACE_RETURN_IF(QWindowsApplication, platformIntegration);
#endif
#if QT_CONFIG(xcb)
    QT_NATIVE_INTERFACE_RETURN_IF(QX11Application, platformNativeInterface());
#endif
#if QT_CONFIG(wayland)
    QT_NATIVE_INTERFACE_RETURN_IF(QWaylandApplication, platformNativeInterface());
#endif
#if defined(Q_OS_VISIONOS)
    QT_NATIVE_INTERFACE_RETURN_IF(QVisionOSApplication, platformIntegration);
#endif

    return QCoreApplication::resolveInterface(name, revision);
}